

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::iterate(SparseBuffersWithCopyOpsTest *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  ContextInfo *pCVar11;
  TestError *this_00;
  uchar *puVar12;
  TestLog *this_01;
  MessageBuilder *pMVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  char *local_240;
  uint local_1dc;
  MessageBuilder local_1d8;
  uint local_58;
  uint local_54;
  uint cmp_offset;
  uint n_temp_copy;
  char *mapped_data;
  int local_34;
  int local_30;
  int copy_src_page_offset;
  int copy_dst_page_offset;
  uint n_page;
  uint n_iteration;
  uint n_test_case;
  Functions *gl;
  SparseBuffersWithCopyOpsTest *pSStack_10;
  bool result;
  SparseBuffersWithCopyOpsTest *this_local;
  
  gl._7_1_ = 1;
  pSStack_10 = this;
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar10->_vptr_RenderContext[3])();
  _n_iteration = CONCAT44(extraout_var,iVar8);
  pCVar11 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar7 = glu::ContextInfo::isExtensionSupported(pCVar11,"GL_ARB_sparse_buffer");
  if (bVar7) {
    pCVar11 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar7 = glu::ContextInfo::isExtensionSupported(pCVar11,"GL_ARB_buffer_storage");
    if (bVar7) {
      bVar7 = initTest(this);
      if (bVar7) {
        for (n_page = 0; n_page < 2; n_page = n_page + 1) {
          for (copy_dst_page_offset = 0; (uint)copy_dst_page_offset < this->m_n_iterations_to_run;
              copy_dst_page_offset = copy_dst_page_offset + 1) {
            if (copy_dst_page_offset != 0) {
              (**(code **)(_n_iteration + 0x158))
                        (0x8892,0,this->m_n_pages_to_test * this->m_page_size,0);
              dVar9 = (**(code **)(_n_iteration + 0x800))();
              glu::checkError(dVar9,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x161b);
            }
            (**(code **)(_n_iteration + 0x158))(0x8892,0,(long)this->m_page_size,1);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glBufferPageCommitmentARB() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1620);
            (**(code **)(_n_iteration + 0x168))(0x8892,0,0x10,this->m_reference_data);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1624);
            for (copy_src_page_offset = 0; (uint)copy_src_page_offset < this->m_n_pages_to_test;
                copy_src_page_offset = copy_src_page_offset + 1) {
              (**(code **)(_n_iteration + 0x158))
                        (0x8892,copy_src_page_offset * this->m_page_size,(long)this->m_page_size,1);
              dVar9 = (**(code **)(_n_iteration + 0x800))();
              glu::checkError(dVar9,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x162b);
              local_30 = 0;
              if (copy_src_page_offset == 0) {
                local_30 = 0x10;
              }
              for (; local_30 < this->m_page_size; local_30 = local_30 + 0x10) {
                local_34 = local_30 + -0x10;
                if (n_page == 0) {
                  (**(code **)(_n_iteration + 0x308))
                            (0x8892,0x8892,copy_src_page_offset * this->m_page_size + local_34,
                             copy_src_page_offset * this->m_page_size + local_30,0x10);
                  dVar9 = (**(code **)(_n_iteration + 0x800))();
                  glu::checkError(dVar9,"glCopyBufferSubData() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x163b);
                }
                else {
                  if (n_page != 1) {
                    this_00 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (this_00,"Unrecognized test case index",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                               ,0x164a);
                    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                  }
                  (**(code **)(_n_iteration + 0x168))
                            (0x8892,copy_src_page_offset * this->m_page_size + local_30,0x10,
                             this->m_reference_data);
                  dVar9 = (**(code **)(_n_iteration + 0x800))();
                  glu::checkError(dVar9,"glBufferSubData() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x1644);
                }
              }
            }
            (**(code **)(_n_iteration + 0x308))(0x8892,0x8893,0,0,this->m_result_data_storage_size);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glCopyBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1653);
            _cmp_offset = (**(code **)(_n_iteration + 0xd00))
                                    (0x8893,0,this->m_page_size * this->m_n_pages_to_test,1);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glMapBufferRange() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1659);
            for (local_54 = 0; local_54 < this->m_result_data_storage_size >> 4;
                local_54 = local_54 + 1) {
              local_58 = local_54 << 4;
              puVar12 = (uchar *)(_cmp_offset + (ulong)local_58);
              cVar14 = -(*puVar12 == this->m_reference_data[0]);
              cVar15 = -(puVar12[1] == this->m_reference_data[1]);
              cVar16 = -(puVar12[2] == this->m_reference_data[2]);
              cVar17 = -(puVar12[3] == this->m_reference_data[3]);
              cVar18 = -(puVar12[4] == this->m_reference_data[4]);
              cVar19 = -(puVar12[5] == this->m_reference_data[5]);
              cVar20 = -(puVar12[6] == this->m_reference_data[6]);
              cVar21 = -(puVar12[7] == this->m_reference_data[7]);
              cVar22 = -(puVar12[8] == this->m_reference_data[8]);
              cVar23 = -(puVar12[9] == this->m_reference_data[9]);
              cVar24 = -(puVar12[10] == this->m_reference_data[10]);
              cVar25 = -(puVar12[0xb] == this->m_reference_data[0xb]);
              cVar26 = -(puVar12[0xc] == this->m_reference_data[0xc]);
              cVar27 = -(puVar12[0xd] == this->m_reference_data[0xd]);
              cVar28 = -(puVar12[0xe] == this->m_reference_data[0xe]);
              bVar29 = -(puVar12[0xf] == this->m_reference_data[0xf]);
              auVar1[1] = cVar15;
              auVar1[0] = cVar14;
              auVar1[2] = cVar16;
              auVar1[3] = cVar17;
              auVar1[4] = cVar18;
              auVar1[5] = cVar19;
              auVar1[6] = cVar20;
              auVar1[7] = cVar21;
              auVar1[8] = cVar22;
              auVar1[9] = cVar23;
              auVar1[10] = cVar24;
              auVar1[0xb] = cVar25;
              auVar1[0xc] = cVar26;
              auVar1[0xd] = cVar27;
              auVar1[0xe] = cVar28;
              auVar1[0xf] = bVar29;
              auVar2[1] = cVar15;
              auVar2[0] = cVar14;
              auVar2[2] = cVar16;
              auVar2[3] = cVar17;
              auVar2[4] = cVar18;
              auVar2[5] = cVar19;
              auVar2[6] = cVar20;
              auVar2[7] = cVar21;
              auVar2[8] = cVar22;
              auVar2[9] = cVar23;
              auVar2[10] = cVar24;
              auVar2[0xb] = cVar25;
              auVar2[0xc] = cVar26;
              auVar2[0xd] = cVar27;
              auVar2[0xe] = cVar28;
              auVar2[0xf] = bVar29;
              auVar6[1] = cVar17;
              auVar6[0] = cVar16;
              auVar6[2] = cVar18;
              auVar6[3] = cVar19;
              auVar6[4] = cVar20;
              auVar6[5] = cVar21;
              auVar6[6] = cVar22;
              auVar6[7] = cVar23;
              auVar6[8] = cVar24;
              auVar6[9] = cVar25;
              auVar6[10] = cVar26;
              auVar6[0xb] = cVar27;
              auVar6[0xc] = cVar28;
              auVar6[0xd] = bVar29;
              auVar5[1] = cVar18;
              auVar5[0] = cVar17;
              auVar5[2] = cVar19;
              auVar5[3] = cVar20;
              auVar5[4] = cVar21;
              auVar5[5] = cVar22;
              auVar5[6] = cVar23;
              auVar5[7] = cVar24;
              auVar5[8] = cVar25;
              auVar5[9] = cVar26;
              auVar5[10] = cVar27;
              auVar5[0xb] = cVar28;
              auVar5[0xc] = bVar29;
              auVar4[1] = cVar19;
              auVar4[0] = cVar18;
              auVar4[2] = cVar20;
              auVar4[3] = cVar21;
              auVar4[4] = cVar22;
              auVar4[5] = cVar23;
              auVar4[6] = cVar24;
              auVar4[7] = cVar25;
              auVar4[8] = cVar26;
              auVar4[9] = cVar27;
              auVar4[10] = cVar28;
              auVar4[0xb] = bVar29;
              auVar3[1] = cVar20;
              auVar3[0] = cVar19;
              auVar3[2] = cVar21;
              auVar3[3] = cVar22;
              auVar3[4] = cVar23;
              auVar3[5] = cVar24;
              auVar3[6] = cVar25;
              auVar3[7] = cVar26;
              auVar3[8] = cVar27;
              auVar3[9] = cVar28;
              auVar3[10] = bVar29;
              if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                           (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                           (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                           (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                           (ushort)((byte)(CONCAT19(bVar29,CONCAT18(cVar28,CONCAT17(cVar27,CONCAT16(
                                                  cVar26,CONCAT15(cVar25,CONCAT14(cVar24,CONCAT13(
                                                  cVar23,CONCAT12(cVar22,CONCAT11(cVar21,cVar20)))))
                                                  )))) >> 7) & 1) << 6 |
                           (ushort)((byte)(CONCAT18(bVar29,CONCAT17(cVar28,CONCAT16(cVar27,CONCAT15(
                                                  cVar26,CONCAT14(cVar25,CONCAT13(cVar24,CONCAT12(
                                                  cVar23,CONCAT11(cVar22,cVar21)))))))) >> 7) & 1)
                           << 7 | (ushort)(bVar29 >> 7) << 0xf) != 0xffff) {
                this_01 = tcu::TestContext::getLog
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                ;
                tcu::TestLog::operator<<
                          (&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar13 = tcu::MessageBuilder::operator<<
                                    (&local_1d8,(char (*) [36])"Invalid data found for page index ["
                                    );
                local_1dc = local_58 / (uint)this->m_page_size;
                pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_1dc);
                pMVar13 = tcu::MessageBuilder::operator<<
                                    (pMVar13,(char (*) [20])"], BO data offset:[");
                pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_58);
                pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x2aea36f);
                tcu::MessageBuilder::operator<<
                          (pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_1d8);
                gl._7_1_ = 0;
                goto LAB_011af8ea;
              }
            }
            (**(code **)(_n_iteration + 0x1670))(0x8893);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glUnmapBuffer() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1671);
            (**(code **)(_n_iteration + 0x168))
                      (0x8893,0,this->m_result_data_storage_size,this->m_clear_buffer);
            dVar9 = (**(code **)(_n_iteration + 0x800))();
            glu::checkError(dVar9,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1677);
            pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            (*pRVar10->_vptr_RenderContext[5])();
          }
        }
      }
      else {
        gl._7_1_ = 0;
      }
    }
  }
LAB_011af8ea:
  if ((gl._7_1_ & 1) == 0) {
    local_240 = "Fail";
  }
  else {
    local_240 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((gl._7_1_ & 1) == 0),local_240);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseBuffersWithCopyOpsTest::iterate()
{
	bool result = true;

	/* Execute the test */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if we're dealing with an OpenGL implementation which supports both:
	 *
	 * 1. GL_ARB_sparse_buffer extension
	 * 2. GL_ARB_buffer_storage extension
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer") ||
		!m_context.getContextInfo().isExtensionSupported("GL_ARB_buffer_storage"))
	{
		goto end;
	}

	/* Set up the test objects */
	if (!initTest())
	{
		result = false;

		goto end;
	}
	for (unsigned int n_test_case = 0; n_test_case < 2; ++n_test_case)
	{
		for (unsigned int n_iteration = 0; n_iteration < m_n_iterations_to_run; ++n_iteration)
		{
			if (n_iteration != 0)
			{
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
										   m_n_pages_to_test * m_page_size, GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
									   m_page_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

			gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							 sizeof(m_reference_data), m_reference_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			for (unsigned int n_page = 0; n_page < m_n_pages_to_test; ++n_page)
			{
				/* Try committing pages in a redundant manner. This is a legal behavior in light of
				 * the GL_ARB_sparse_buffer spec */
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, n_page * m_page_size, m_page_size, GL_TRUE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

				for (int copy_dst_page_offset = static_cast<int>((n_page == 0) ? sizeof(m_reference_data) : 0);
					 copy_dst_page_offset < static_cast<int>(m_page_size);
					 copy_dst_page_offset += static_cast<int>(sizeof(m_reference_data)))
				{
					const int copy_src_page_offset =
						static_cast<const int>(copy_dst_page_offset - sizeof(m_reference_data));

					switch (n_test_case)
					{
					case 0:
					{
						gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ARRAY_BUFFER,
											 n_page * m_page_size + copy_src_page_offset,
											 n_page * m_page_size + copy_dst_page_offset, sizeof(m_reference_data));
						GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

						break;
					}

					case 1:
					{
						gl.bufferSubData(GL_ARRAY_BUFFER, n_page * m_page_size + copy_dst_page_offset,
										 sizeof(m_reference_data), m_reference_data);
						GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

						break;
					}

					default:
						TCU_FAIL("Unrecognized test case index");
					} /* switch (n_test_case) */
				}	 /* for (all valid destination copy op offsets) */
			}		  /* for (all test pages) */

			/* Copy data from the sparse buffer to a mappable immutable buffer storage */
			gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER, 0, /* readOffset */
								 0,											  /* writeOffset */
								 m_result_data_storage_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

			/* Map the data we have obtained */
			char* mapped_data = (char*)gl.mapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
														 m_page_size * m_n_pages_to_test, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the data is valid */
			for (unsigned int n_temp_copy = 0; n_temp_copy < m_result_data_storage_size / sizeof(m_reference_data);
				 ++n_temp_copy)
			{
				const unsigned int cmp_offset = static_cast<const unsigned int>(n_temp_copy * sizeof(m_reference_data));

				if (memcmp(mapped_data + cmp_offset, m_reference_data, sizeof(m_reference_data)) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data found for page index "
																   "["
									   << (cmp_offset / m_page_size) << "]"
																		", BO data offset:"
																		"["
									   << cmp_offset << "]." << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* for (all datasets) */

			/* Clean up */
			gl.unmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Also, zero out the other buffer object we copy the result data to, in case
			 * the glCopyBufferSubData() call does not modify it at all */
			gl.bufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
							 m_result_data_storage_size, m_clear_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* NOTE: This test passes fine on the misbehaving driver *if* the swapbuffers operation
			 *       issued as a part of the call below is not executed. */
			m_context.getRenderContext().postIterate();
		} /* for (all test iterations) */
	}	 /* for (all test cases) */

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}